

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  byte *pbVar8;
  byte bVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  byte *local_40;
  char **local_38;
  
  uVar6 = (long)end - (long)ptr;
  if ((long)uVar6 < 2) {
    return -1;
  }
  bVar3 = false;
LAB_00180fb1:
  iVar11 = 0;
  bVar1 = *ptr;
  pbVar8 = (byte *)ptr;
  local_38 = nextTokPtr;
  if (bVar1 < 0xdc) {
    if (bVar1 == 0) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1])) {
      case 6:
LAB_0018148d:
        if (uVar6 == 2) {
          return -2;
        }
        break;
      case 7:
        goto switchD_00180fe4_caseD_7;
      case 9:
      case 10:
      case 0x15:
        ptr = (char *)((byte *)ptr + 2);
        lVar5 = (long)end - (long)ptr;
        while( true ) {
          if (lVar5 < 2) {
            return -1;
          }
          pbVar8 = (byte *)ptr;
          if (*ptr != 0) goto switchD_00180fe4_caseD_8;
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
          if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
          ptr = (char *)((byte *)ptr + 2);
          lVar5 = lVar5 + -2;
        }
        if (bVar1 == 0xe) goto switchD_00180fe4_caseD_e;
        break;
      case 0xe:
switchD_00180fe4_caseD_e:
        local_40 = (byte *)ptr + 2;
        if ((long)end - (long)local_40 < 2) {
          return -1;
        }
        pcVar7 = end + (-4 - (long)ptr);
        while( true ) {
          if (*local_40 != 0) goto switchD_00181230_caseD_0;
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)local_40[1]);
          uVar12 = (uint)bVar1;
          if ((uVar12 & 0xfffffffe) == 0xc) break;
          if ((0x15 < uVar12) || ((0x200600U >> (uVar12 & 0x1f) & 1) == 0))
          goto switchD_00181230_caseD_0;
          local_40 = local_40 + 2;
          bVar3 = (long)pcVar7 < 2;
          pcVar7 = pcVar7 + -2;
          if (bVar3) {
            return -1;
          }
        }
        local_40 = local_40 + 2;
        if ((long)pcVar7 < 2) {
          return -1;
        }
        do {
          iVar11 = 0;
          bVar2 = *local_40;
          if (bVar2 < 0xdc) {
            bVar9 = 7;
            if (3 < bVar2 - 0xd8) {
              if (bVar2 == 0) {
                bVar9 = *(byte *)((long)enc[1].scanners + (ulong)local_40[1]);
              }
              else {
LAB_0018120d:
                bVar9 = 0x1d;
              }
            }
          }
          else if (bVar2 - 0xdc < 4) {
            bVar9 = 8;
          }
          else if ((bVar2 != 0xff) || (bVar9 = 0, local_40[1] < 0xfe)) goto LAB_0018120d;
          if (bVar9 == bVar1) goto LAB_0018131a;
          switch(bVar9) {
          case 0:
          case 1:
          case 2:
          case 8:
            goto switchD_00181230_caseD_0;
          case 3:
            iVar4 = big2_scanRef(enc,(char *)(local_40 + 2),end,(char **)&local_40);
            nextTokPtr = local_38;
            if (iVar4 < 1) {
              iVar11 = 0;
              pbVar8 = local_40;
              if (iVar4 != 0) {
                return iVar4;
              }
              goto switchD_00180fe4_caseD_8;
            }
            break;
          default:
            local_40 = local_40 + 2;
            break;
          case 6:
            if (pcVar7 == (char *)0x2) {
              return -2;
            }
            local_40 = local_40 + 3;
            break;
          case 7:
            if (pcVar7 < (char *)0x4) {
              return -2;
            }
            local_40 = local_40 + 4;
          }
          pcVar7 = end + -(long)local_40;
          if ((long)pcVar7 < 2) {
            return -1;
          }
        } while( true );
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_00180fe4_caseD_16;
      case 0x17:
        if (bVar3) break;
        pbVar8 = (byte *)ptr + 2;
        uVar6 = (long)end - (long)pbVar8;
        if ((long)uVar6 < 2) {
          return -1;
        }
        bVar1 = *pbVar8;
        if (0xdb < bVar1) {
          if (bVar1 == 0xff) {
            if (0xfd < ((byte *)ptr)[3]) break;
          }
          else if (bVar1 - 0xdc < 4) break;
LAB_001812d7:
          if ((*(uint *)((long)namingBitmap +
                        (ulong)(((byte *)ptr)[3] >> 3 & 0x1c |
                               (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
               (((byte *)ptr)[3] & 0x1f) & 1) == 0) break;
LAB_00181300:
          ptr = (char *)((byte *)ptr + 4);
          bVar3 = true;
          goto LAB_00181091;
        }
        if (bVar1 == 0) {
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]);
          if (bVar2 < 0x18) {
            if (bVar2 != 0x16) {
              if (bVar2 == 6) goto LAB_0018148d;
              if (bVar2 != 7) break;
              goto LAB_00181453;
            }
          }
          else if (bVar2 != 0x18) {
            if (bVar2 != 0x1d) break;
            goto LAB_001812d7;
          }
          goto LAB_00181300;
        }
        if (3 < bVar1 - 0xd8) goto LAB_001812d7;
        goto LAB_00181453;
      case 0x1d:
        goto switchD_00180fe4_caseD_1d;
      }
    }
    else {
      if (3 < bVar1 - 0xd8) goto switchD_00180fe4_caseD_1d;
switchD_00180fe4_caseD_7:
LAB_00181453:
      if (uVar6 < 4) {
        return -2;
      }
    }
    goto switchD_00180fe4_caseD_8;
  }
  if (bVar1 == 0xff) {
    if (0xfd < ((byte *)ptr)[1]) goto switchD_00180fe4_caseD_8;
  }
  else if (bVar1 - 0xdc < 4) goto switchD_00180fe4_caseD_8;
switchD_00180fe4_caseD_1d:
  if ((*(uint *)((long)namingBitmap +
                (ulong)(((byte *)ptr)[1] >> 3 & 0x1c |
                       (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
       (((byte *)ptr)[1] & 0x1f) & 1) == 0) goto switchD_00180fe4_caseD_8;
switchD_00180fe4_caseD_16:
  ptr = (char *)((byte *)ptr + 2);
  goto LAB_00181091;
switchD_00181230_caseD_0:
  pbVar8 = local_40;
  local_38 = nextTokPtr;
  iVar11 = 0;
  goto switchD_00180fe4_caseD_8;
LAB_0018131a:
  pbVar10 = local_40 + 2;
  if ((long)end - (long)pbVar10 < 2) {
    return -1;
  }
  pbVar8 = pbVar10;
  local_38 = nextTokPtr;
  if (*pbVar10 == 0) {
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)local_40[3]);
    uVar12 = (uint)bVar1;
    if (bVar1 < 0xb) {
      if (1 < uVar12 - 9) goto switchD_00180fe4_caseD_8;
    }
    else if (bVar1 != 0x15) {
      if (uVar12 == 0xb) {
LAB_00181530:
        pbVar8 = pbVar10 + 2;
        iVar11 = 1;
      }
      else if (uVar12 == 0x11) {
LAB_001814dc:
        pbVar8 = pbVar10 + 2;
        if ((long)end - (long)pbVar8 < 2) {
          return -1;
        }
        iVar11 = 0;
        if (*pbVar8 == 0) {
          if (pbVar10[3] == 0x3e) {
            pbVar8 = pbVar10 + 4;
          }
          iVar11 = (uint)(pbVar10[3] == 0x3e) * 3;
        }
      }
      goto switchD_00180fe4_caseD_8;
    }
    pbVar8 = local_40 + 4;
    if ((long)end - (long)pbVar8 < 2) {
      return -1;
    }
    ptr = (char *)(local_40 + 6);
    pcVar7 = end + (-6 - (long)local_40);
    while( true ) {
      bVar1 = ((byte *)ptr)[-2];
      if (bVar1 != 0) break;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[-1])) {
      case 6:
        if (pcVar7 == (char *)0x0) {
          return -2;
        }
        goto switchD_001813c5_caseD_8;
      case 7:
        goto switchD_001813c5_caseD_7;
      default:
        goto switchD_001813c5_caseD_8;
      case 9:
      case 10:
      case 0x15:
        pbVar8 = pbVar8 + 2;
        ptr = (char *)((byte *)ptr + 2);
        bVar3 = (long)pcVar7 < 2;
        pcVar7 = pcVar7 + -2;
        if (bVar3) {
          return -1;
        }
        break;
      case 0xb:
        pbVar10 = (byte *)ptr + -2;
        goto LAB_00181530;
      case 0x11:
        pbVar10 = (byte *)ptr + -2;
        goto LAB_001814dc;
      case 0x16:
      case 0x18:
        goto switchD_001813c5_caseD_16;
      case 0x1d:
        goto switchD_001813c5_caseD_1d;
      }
    }
    if (bVar1 - 0xd8 < 4) {
switchD_001813c5_caseD_7:
      if (pcVar7 + 2 < (char *)0x4) {
        return -2;
      }
    }
    else if ((3 < bVar1 - 0xdc) && ((bVar1 != 0xff || (((byte *)ptr)[-1] < 0xfe)))) {
switchD_001813c5_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(((byte *)ptr)[-1] >> 3 & 0x1c |
                           (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
           (((byte *)ptr)[-1] & 0x1f) & 1) != 0) {
switchD_001813c5_caseD_16:
        bVar3 = false;
LAB_00181091:
        uVar6 = (long)end - (long)ptr;
        if ((long)uVar6 < 2) {
          return -1;
        }
        goto LAB_00180fb1;
      }
      goto switchD_00180fe4_caseD_8;
    }
switchD_001813c5_caseD_8:
    pbVar8 = (byte *)ptr + -2;
  }
switchD_00180fe4_caseD_8:
  *local_38 = (char *)pbVar8;
  return iVar11;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr) {
#  ifdef XML_NS
  int hadColon = 0;
#  endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#  ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#  endif
    case BT_S:
    case BT_CR:
    case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS: {
      int open;
#  ifdef XML_NS
      hadColon = 0;
#  endif
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        open = BYTE_TYPE(enc, ptr);
        if (open == BT_QUOT || open == BT_APOS)
          break;
        switch (open) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      ptr += MINBPC(enc);
      /* in attribute value */
      for (;;) {
        int t;
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == open)
          break;
        switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_AMP: {
          int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
          if (tok <= 0) {
            if (tok == XML_TOK_INVALID)
              *nextTokPtr = ptr;
            return tok;
          }
          break;
        }
        case BT_LT:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
        break;
      case BT_SOL:
        goto sol;
      case BT_GT:
        goto gt;
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* ptr points to closing quote */
      for (;;) {
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
        case BT_S:
        case BT_CR:
        case BT_LF:
          continue;
        case BT_GT:
        gt:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_START_TAG_WITH_ATTS;
        case BT_SOL:
        sol:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        break;
      }
      break;
    }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}